

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_stream.c
# Opt level: O3

cio_error cio_buffered_stream_init(cio_buffered_stream *buffered_stream,cio_io_stream *stream)

{
  cio_error cVar1;
  
  cVar1 = CIO_INVALID_ARGUMENT;
  if ((buffered_stream != (cio_buffered_stream *)0x0) && (stream != (cio_io_stream *)0x0)) {
    buffered_stream->stream = stream;
    buffered_stream->callback_is_running = 0;
    buffered_stream->shall_close = false;
    cVar1 = CIO_SUCCESS;
  }
  return cVar1;
}

Assistant:

enum cio_error cio_buffered_stream_init(struct cio_buffered_stream *buffered_stream,
                                        struct cio_io_stream *stream)
{
	if (cio_unlikely((buffered_stream == NULL) || (stream == NULL))) {
		return CIO_INVALID_ARGUMENT;
	}

	buffered_stream->stream = stream;
	buffered_stream->callback_is_running = 0;
	buffered_stream->shall_close = false;

	return CIO_SUCCESS;
}